

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

int Sbd_ManCutServerFirst(Sbd_Srv_t *p,int iObj,int *pLeaves)

{
  int iVar1;
  int LevStop_00;
  int iVar2;
  int *piVar3;
  int LevStop;
  int RetValue;
  int *pLeaves_local;
  int iObj_local;
  Sbd_Srv_t *p_local;
  
  iVar1 = Vec_IntEntry(p->vLutLevs,iObj);
  LevStop_00 = iVar1 + -2;
  Vec_IntClear(p->vCut);
  Gia_ManIncrementTravId(p->pGia);
  iVar2 = Sbd_ManCutCollect_rec(p->pGia,p->vMirrors,iObj,LevStop_00,p->vLutLevs,p->vCut);
  if (iVar2 == 0) {
    p_local._4_4_ = -1;
  }
  else {
    Vec_IntSort(p->vCut,0);
    Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
    Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop_00,p->vCut,p->vCutTop,p->vCutBot);
    iVar2 = Vec_IntSize(p->vCut);
    if ((p->nCutSize < iVar2) || (iVar2 = Vec_IntSize(p->vCutTop), p->nLutSize + -1 < iVar2)) {
      Vec_IntClear(p->vCut0);
      Vec_IntAppend(p->vCut0,p->vCut);
      iVar2 = Vec_IntSize(p->vCut);
      if ((iVar2 < p->nCutSize) &&
         (iVar2 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,p->vCut,p->vCutTop,
                                      p->nCutSize), iVar2 != 0)) {
        Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
        Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop_00,p->vCut,p->vCutTop,p->vCutBot);
        iVar2 = Vec_IntSize(p->vCut);
        if (p->nCutSize < iVar2) {
          __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                        ,0x15a,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
        }
        iVar2 = Vec_IntSize(p->vCutTop);
        if (iVar2 <= p->nLutSize + -1) {
          piVar3 = Vec_IntArray(p->vCut);
          iVar1 = Vec_IntSize(p->vCut);
          memcpy(pLeaves,piVar3,(long)iVar1 << 2);
          iVar1 = Vec_IntSize(p->vCut);
          return iVar1;
        }
        iVar2 = Vec_IntSize(p->vCut);
        if ((iVar2 < p->nCutSize) &&
           (iVar2 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,p->vCut,p->vCutTop,
                                        p->nCutSize), iVar2 != 0)) {
          Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
          Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop_00,p->vCut,p->vCutTop,p->vCutBot);
          iVar2 = Vec_IntSize(p->vCut);
          if (p->nCutSize < iVar2) {
            __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                          ,0x166,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
          }
          iVar2 = Vec_IntSize(p->vCutTop);
          if (iVar2 <= p->nLutSize + -1) {
            piVar3 = Vec_IntArray(p->vCut);
            iVar1 = Vec_IntSize(p->vCut);
            memcpy(pLeaves,piVar3,(long)iVar1 << 2);
            iVar1 = Vec_IntSize(p->vCut);
            return iVar1;
          }
          iVar2 = Vec_IntSize(p->vCut);
          if ((iVar2 < p->nCutSize) &&
             (iVar2 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,p->vCut,p->vCutTop,
                                          p->nCutSize), iVar2 != 0)) {
            Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
            Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop_00,p->vCut,p->vCutTop,p->vCutBot);
            iVar2 = Vec_IntSize(p->vCut);
            if (p->nCutSize < iVar2) {
              __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                            ,0x172,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
            }
            iVar2 = Vec_IntSize(p->vCutTop);
            if (iVar2 <= p->nLutSize + -1) {
              piVar3 = Vec_IntArray(p->vCut);
              iVar1 = Vec_IntSize(p->vCut);
              memcpy(pLeaves,piVar3,(long)iVar1 << 2);
              iVar1 = Vec_IntSize(p->vCut);
              return iVar1;
            }
            iVar2 = Vec_IntSize(p->vCut);
            if ((iVar2 < p->nCutSize) &&
               (iVar2 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,p->vCut,p->vCutTop,
                                            p->nCutSize), iVar2 != 0)) {
              Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
              Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop_00,p->vCut,p->vCutTop,p->vCutBot);
              iVar2 = Vec_IntSize(p->vCut);
              if (p->nCutSize < iVar2) {
                __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                              ,0x17e,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
              }
              iVar2 = Vec_IntSize(p->vCutTop);
              if (iVar2 <= p->nLutSize + -1) {
                piVar3 = Vec_IntArray(p->vCut);
                iVar1 = Vec_IntSize(p->vCut);
                memcpy(pLeaves,piVar3,(long)iVar1 << 2);
                iVar1 = Vec_IntSize(p->vCut);
                return iVar1;
              }
            }
          }
        }
      }
      Vec_IntClear(p->vCut);
      Gia_ManIncrementTravId(p->pGia);
      iVar1 = Sbd_ManCutCollect_rec(p->pGia,p->vMirrors,iObj,iVar1 + -3,p->vLutLevs,p->vCut);
      if (iVar1 == 0) {
        p_local._4_4_ = -1;
      }
      else {
        Vec_IntSort(p->vCut,0);
        Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
        Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop_00,p->vCut,p->vCutTop,p->vCutBot);
        iVar1 = Vec_IntSize(p->vCut);
        if ((p->nCutSize < iVar1) || (iVar1 = Vec_IntSize(p->vCutTop), p->nLutSize + -1 < iVar1)) {
          p_local._4_4_ = -1;
        }
        else {
          piVar3 = Vec_IntArray(p->vCut);
          iVar1 = Vec_IntSize(p->vCut);
          memcpy(pLeaves,piVar3,(long)iVar1 << 2);
          p_local._4_4_ = Vec_IntSize(p->vCut);
        }
      }
    }
    else {
      piVar3 = Vec_IntArray(p->vCut);
      iVar1 = Vec_IntSize(p->vCut);
      memcpy(pLeaves,piVar3,(long)iVar1 << 2);
      p_local._4_4_ = Vec_IntSize(p->vCut);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Sbd_ManCutServerFirst( Sbd_Srv_t * p, int iObj, int * pLeaves )
{
    int RetValue, LevStop = Vec_IntEntry(p->vLutLevs, iObj) - 2;

    Vec_IntClear( p->vCut );
    Gia_ManIncrementTravId( p->pGia );
    RetValue = Sbd_ManCutCollect_rec( p->pGia, p->vMirrors, iObj, LevStop, p->vLutLevs, p->vCut );
    if ( RetValue == 0 ) // cannot build delay-improving cut
        return -1;
    // check if the current cut is good
    Vec_IntSort( p->vCut, 0 );
/*
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }
*/
    // try to expand the cut
    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "1=(%d,%d) ", Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }

    // try to reduce the topmost
    Vec_IntClear( p->vCut0 );
    Vec_IntAppend( p->vCut0, p->vCut );
    if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
    {
        Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
        Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
        assert( Vec_IntSize(p->vCut) <= p->nCutSize );
        if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
        {
            //printf( "%d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
            memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
            return Vec_IntSize(p->vCut);
        }
        // try again
        if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
        {
            Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
            Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
            assert( Vec_IntSize(p->vCut) <= p->nCutSize );
            if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
            {
                //printf( "* %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                return Vec_IntSize(p->vCut);
            }
            // try again
            if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
            {
                Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
                Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
                assert( Vec_IntSize(p->vCut) <= p->nCutSize );
                if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
                {
                    //printf( "** %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                    memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                    return Vec_IntSize(p->vCut);
                }
                // try again
                if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
                {
                    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
                    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
                    assert( Vec_IntSize(p->vCut) <= p->nCutSize );
                    if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
                    {
                        //printf( "*** %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                        return Vec_IntSize(p->vCut);
                    }
                }
            }
        }
    }

    // recompute the cut
    Vec_IntClear( p->vCut );
    Gia_ManIncrementTravId( p->pGia );
    RetValue = Sbd_ManCutCollect_rec( p->pGia, p->vMirrors, iObj, LevStop-1, p->vLutLevs, p->vCut );
    if ( RetValue == 0 ) // cannot build delay-improving cut
        return -1;
    // check if the current cut is good
    Vec_IntSort( p->vCut, 0 );
/*
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }
*/
    // try to expand the cut
    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "2=(%d,%d) ", Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }

    return -1;
}